

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

entityfilter_ctx * ctemplate_htmlparser::entityfilter_new(void)

{
  entityfilter_ctx *ctx;
  
  ctx = (entityfilter_ctx *)malloc(0x1c);
  if (ctx == (entityfilter_ctx *)0x0) {
    ctx = (entityfilter_ctx *)0x0;
  }
  else {
    ctx->buffer[0] = '\0';
    ctx->buffer_pos = 0;
    ctx->in_entity = 0;
  }
  return ctx;
}

Assistant:

entityfilter_ctx *entityfilter_new()
{
    entityfilter_ctx *ctx;
    ctx = CAST(entityfilter_ctx *,
               malloc(sizeof(entityfilter_ctx)));

    if (ctx == NULL)
      return NULL;
    ctx->buffer[0] = 0;
    ctx->buffer_pos = 0;
    ctx->in_entity = 0;

    return ctx;
}